

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condensation.cpp
# Opt level: O2

Clause * __thiscall Inferences::Condensation::simplify(Condensation *this,Clause *cl)

{
  Literal **ppLVar1;
  Literal *lit;
  bool bVar2;
  int iVar3;
  pair<unsigned_int,_unsigned_int> pVar4;
  undefined4 extraout_var;
  Literal *pLVar5;
  uint i_1;
  uint uVar6;
  EVP_PKEY_CTX *pEVar8;
  uint i;
  ulong uVar9;
  ulong uVar10;
  EVP_PKEY_CTX *ctx;
  Clause *local_1b0;
  SubstIterator sit;
  CombinationIterator<unsigned_int> pairIt;
  InstanceIterator iit;
  LiteralMiniIndex cmi;
  Inference local_128;
  RobSubstitution subst0;
  uint uVar7;
  
  uVar7 = (uint)*(undefined8 *)&cl->field_0x38;
  uVar6 = uVar7 & 0xfffff;
  local_1b0 = cl;
  if (1 < uVar6) {
    if (simplify(Kernel::Clause*)::newLits == '\0') {
      iVar3 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::newLits);
      if (iVar3 != 0) {
        Lib::DArray<Kernel::Literal_*>::DArray(&simplify::newLits,0x20);
        __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&simplify::newLits,&__dso_handle);
        __cxa_guard_release(&simplify(Kernel::Clause*)::newLits);
      }
    }
    if (simplify(Kernel::Clause*)::alts == '\0') {
      iVar3 = __cxa_guard_acquire(&simplify(Kernel::Clause*)::alts);
      if (iVar3 != 0) {
        Lib::DArray<Lib::List<Kernel::Literal_*>_*>::DArray(&simplify::alts,0x20);
        __cxa_atexit(Lib::DArray<Lib::List<Kernel::Literal_*>_*>::~DArray,&simplify::alts,
                     &__dso_handle);
        __cxa_guard_release(&simplify(Kernel::Clause*)::alts);
      }
    }
    Indexing::LiteralMiniIndex::LiteralMiniIndex(&cmi,cl);
    Lib::CombinationIterator<unsigned_int>::CombinationIterator(&pairIt,0,uVar6);
    uVar6 = uVar6 - 1;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar6;
    while (pairIt._second != pairIt._afterLast) {
      pVar4 = Lib::CombinationIterator<unsigned_int>::next(&pairIt);
      if (pVar4.first != pVar4.second) {
        lit = cl->_literals[(int)pVar4.first];
        pLVar5 = cl->_literals[(long)pVar4 >> 0x20];
        Lib::DArray<Kernel::Literal_*>::ensure(&simplify::newLits,(size_t)ctx);
        Kernel::RobSubstitution::RobSubstitution(&subst0);
        Kernel::RobSubstitution::unifiers
                  ((RobSubstitution *)&sit,(Literal *)&subst0,(int)lit,(Literal *)0x0,(int)pLVar5,
                   false);
        while( true ) {
          iVar3 = (*(sit._core)->_vptr_IteratorCore[2])();
          if ((char)iVar3 == '\0') break;
          iVar3 = (*(sit._core)->_vptr_IteratorCore[3])();
          iit.super_IteratorBase._ready = false;
          iit.super_IteratorBase._1_3_ = 0;
          iit.super_IteratorBase._hdr = 0;
          Lib::DArray<Lib::List<Kernel::Literal_*>_*>::init(&simplify::alts,ctx);
          pLVar5 = Kernel::RobSubstitution::apply
                             ((RobSubstitution *)CONCAT44(extraout_var,iVar3),lit,0);
          *simplify::newLits._array = pLVar5;
          Indexing::LiteralMiniIndex::IteratorBase::IteratorBase
                    (&iit.super_IteratorBase,&cmi,pLVar5,false);
          bVar2 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                            ((InstanceIterator *)&iit.super_IteratorBase);
          if (bVar2) {
            while( true ) {
              bVar2 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                ((InstanceIterator *)&iit.super_IteratorBase);
              if (!bVar2) break;
              iit.super_IteratorBase._0_8_ = iit.super_IteratorBase._0_8_ & 0xffffffffffffff00;
              ppLVar1 = &(iit.super_IteratorBase._curr)->_lit;
              iit.super_IteratorBase._curr = iit.super_IteratorBase._curr + 1;
              Lib::List<Kernel::Literal_*>::push(*ppLVar1,simplify::alts._array);
            }
            uVar10 = 1;
            for (uVar9 = 0; uVar9 != (uVar7 & 0xfffff); uVar9 = uVar9 + 1) {
              if (uVar9 != (ulong)pVar4 >> 0x20 && uVar9 != ((ulong)pVar4 & 0xffffffff)) {
                pLVar5 = Kernel::RobSubstitution::apply
                                   ((RobSubstitution *)CONCAT44(extraout_var,iVar3),
                                    cl->_literals[uVar9],0);
                simplify::newLits._array[uVar10] = pLVar5;
                Indexing::LiteralMiniIndex::IteratorBase::IteratorBase
                          (&iit.super_IteratorBase,&cmi,pLVar5,false);
                bVar2 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                  ((InstanceIterator *)&iit.super_IteratorBase);
                if (!bVar2) goto LAB_003e3d73;
                while( true ) {
                  bVar2 = Indexing::LiteralMiniIndex::InstanceIterator::hasNext
                                    ((InstanceIterator *)&iit.super_IteratorBase);
                  if (!bVar2) break;
                  iit.super_IteratorBase._0_8_ = iit.super_IteratorBase._0_8_ & 0xffffffffffffff00;
                  ppLVar1 = &(iit.super_IteratorBase._curr)->_lit;
                  iit.super_IteratorBase._curr = iit.super_IteratorBase._curr + 1;
                  Lib::List<Kernel::Literal_*>::push(*ppLVar1,simplify::alts._array + uVar10);
                }
                uVar10 = (ulong)((int)uVar10 + 1);
              }
            }
            bVar2 = Kernel::MLMatcher::canBeMatched
                              (simplify::newLits._array,uVar6,cl,simplify::alts._array,
                               (Literal *)0x0,false);
          }
          else {
LAB_003e3d73:
            bVar2 = false;
          }
          for (pEVar8 = (EVP_PKEY_CTX *)0x0; ctx != pEVar8; pEVar8 = pEVar8 + 1) {
            Lib::List<Kernel::Literal_*>::destroy(simplify::alts._array[(long)pEVar8]);
          }
          if (bVar2 != false) {
            *(int *)(DAT_00a141a0 + 0x16c) = *(int *)(DAT_00a141a0 + 0x16c) + 1;
            ppLVar1 = simplify::newLits._array;
            iit.super_IteratorBase._ready = true;
            iit.super_IteratorBase._query = (Literal *)cl;
            Kernel::Inference::Inference(&local_128,(SimplifyingInference1 *)&iit);
            local_1b0 = Kernel::Clause::fromArray(ppLVar1,uVar6,&local_128);
            Lib::VirtualIterator<Kernel::RobSubstitution_*>::~VirtualIterator(&sit);
            Kernel::RobSubstitution::~RobSubstitution(&subst0);
            goto LAB_003e3e44;
          }
        }
        Lib::VirtualIterator<Kernel::RobSubstitution_*>::~VirtualIterator(&sit);
        Kernel::RobSubstitution::~RobSubstitution(&subst0);
      }
    }
LAB_003e3e44:
    Lib::DArray<Indexing::LiteralMiniIndex::Entry>::~DArray(&cmi._entries);
  }
  return local_1b0;
}

Assistant:

Clause* Condensation::simplify(Clause* cl)
{
  TIME_TRACE("condensation");

  unsigned clen=cl->length();
  if(clen<=1) {
    return cl;
  }
  unsigned newLen=clen-1;

  // stores newLen new literals
  static DArray<Literal*> newLits(32);
  //
  static DArray<LiteralList*> alts(32);

  LiteralMiniIndex cmi(cl);

  // For each pair of non-equal literals l1 and l2
  //
  CombinationIterator<unsigned> pairIt(0, clen);
  while(pairIt.hasNext()) {
    pair<unsigned,unsigned> lpair=pairIt.next();
    unsigned l1Index=lpair.first;
    unsigned l2Index=lpair.second;
    if(l1Index==l2Index) {
      continue;
    }
    Literal* l1=(*cl)[l1Index];
    Literal* l2=(*cl)[l2Index];

    newLits.ensure(newLen);

    RobSubstitution subst0;
    // For each unifying subst of l1 and l2
    // apply the subst to l1 and search for instances of this in the clause
    // (note that this is symmetric to applying subst to l2)
    SubstIterator sit=subst0.unifiers(l1,0,l2,0,false);
    while(sit.hasNext()) {
      RobSubstitution* subst=sit.next();
      alts.init(newLen,0);
      bool success=false;

      unsigned next=0;
      {
        Literal* lit=subst->apply(l1,0);
        newLits[next] = lit;
        // Use lit as a query to find instances of it in cmi (i.e. the clause)
        LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
        if(!iit.hasNext()) {
          // If there are no instances then finish
          goto match_fin;
        }
        // Store all instances in alts (alts[next] is a literal list)
        while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
        }
        next++;
      }

      // For all literals that are not l1 or l2
      // apply the subst and search for instances of the result as before
      for(unsigned i=0;i<clen;i++) {
        if(i!=l1Index && i!=l2Index) {
          Literal* lit=subst->apply((*cl)[i],0);
          newLits[next] = lit;
          LiteralMiniIndex::InstanceIterator iit(cmi, lit, false);
          if(!iit.hasNext()) {
            goto match_fin;
          }
          while(iit.hasNext()) {
	    LiteralList::push(iit.next(), alts[next]);
          }
          next++;
        }
      }

      // I think this is asking if there is a substitution that will match
      // each lit in newLits with one of its instances in alts
      // CHECK!
      success=MLMatcher::canBeMatched(newLits.array(), newLen, cl,alts.array(),0,false);

    // We will jump here if we do not find a match, in this case success will be false
    match_fin:
      for(unsigned i=0;i<newLen;i++) {
        LiteralList::destroy(alts[i]);
      }

      if(success) {
        env.statistics->condensations++;
        return Clause::fromArray(newLits.begin(), newLen, SimplifyingInference1(InferenceRule::CONDENSATION, cl));
      }
    }
  }
  return cl;
}